

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

int xmlRegCompactPushString(xmlRegExecCtxtPtr exec,xmlRegexpPtr comp,xmlChar *value,void *data)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int local_38;
  int target;
  int i;
  int state;
  void *data_local;
  xmlChar *value_local;
  xmlRegexpPtr comp_local;
  xmlRegExecCtxtPtr exec_local;
  
  iVar1 = exec->index;
  if (((comp == (xmlRegexpPtr)0x0) || (comp->compact == (int *)0x0)) ||
     (comp->stringMap == (xmlChar **)0x0)) {
    exec_local._4_4_ = -1;
  }
  else if (value == (xmlChar *)0x0) {
    if (comp->compact[iVar1 * (comp->nbstrings + 1)] == 2) {
      exec_local._4_4_ = 1;
    }
    else {
      exec_local._4_4_ = 0;
    }
  }
  else {
    for (local_38 = 0; local_38 < comp->nbstrings; local_38 = local_38 + 1) {
      iVar2 = comp->compact[iVar1 * (comp->nbstrings + 1) + local_38 + 1];
      if ((0 < iVar2) && (iVar2 <= comp->nbstates)) {
        iVar2 = iVar2 + -1;
        iVar3 = xmlRegStrEqualWildcard(comp->stringMap[local_38],value);
        if (iVar3 != 0) {
          exec->index = iVar2;
          if ((exec->callback != (xmlRegExecCallbacks)0x0) && (comp->transdata != (void **)0x0)) {
            (*exec->callback)((xmlRegExecCtxtPtr)exec->data,value,
                              comp->transdata[iVar1 * comp->nbstrings + local_38],data);
          }
          if (comp->compact[iVar2 * (comp->nbstrings + 1)] != 4) {
            if (comp->compact[iVar2 * (comp->nbstrings + 1)] == 2) {
              return 1;
            }
            return 0;
          }
          break;
        }
      }
    }
    exec->errStateNo = iVar1;
    exec->status = -1;
    xmlRegExecSetErrString(exec,value);
    exec_local._4_4_ = exec->status;
  }
  return exec_local._4_4_;
}

Assistant:

static int
xmlRegCompactPushString(xmlRegExecCtxtPtr exec,
	                xmlRegexpPtr comp,
	                const xmlChar *value,
	                void *data) {
    int state = exec->index;
    int i, target;

    if ((comp == NULL) || (comp->compact == NULL) || (comp->stringMap == NULL))
	return(-1);

    if (value == NULL) {
	/*
	 * are we at a final state ?
	 */
	if (comp->compact[state * (comp->nbstrings + 1)] ==
            XML_REGEXP_FINAL_STATE)
	    return(1);
	return(0);
    }

    /*
     * Examine all outside transitions from current state
     */
    for (i = 0;i < comp->nbstrings;i++) {
	target = comp->compact[state * (comp->nbstrings + 1) + i + 1];
	if ((target > 0) && (target <= comp->nbstates)) {
	    target--; /* to avoid 0 */
	    if (xmlRegStrEqualWildcard(comp->stringMap[i], value)) {
		exec->index = target;
		if ((exec->callback != NULL) && (comp->transdata != NULL)) {
		    exec->callback(exec->data, value,
			  comp->transdata[state * comp->nbstrings + i], data);
		}
		if (comp->compact[target * (comp->nbstrings + 1)] ==
		    XML_REGEXP_SINK_STATE)
		    goto error;

		if (comp->compact[target * (comp->nbstrings + 1)] ==
		    XML_REGEXP_FINAL_STATE)
		    return(1);
		return(0);
	    }
	}
    }
    /*
     * Failed to find an exit transition out from current state for the
     * current token
     */
error:
    exec->errStateNo = state;
    exec->status = XML_REGEXP_NOT_FOUND;
    xmlRegExecSetErrString(exec, value);
    return(exec->status);
}